

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall
sznet::net::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  sz_sock sVar1;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  undefined1 auStack_38 [8];
  sockaddr_in6 addr;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
  addr.sin6_addr.__in6_u._4_8_ = 0;
  auStack_38._0_2_ = 0;
  auStack_38._2_2_ = 0;
  auStack_38._4_4_ = 0;
  addr.sin6_family = 0;
  addr.sin6_port = 0;
  addr.sin6_flowinfo = 0;
  sVar1 = sockets::sz_accept(this->m_sockfd,(sockaddr_in6 *)auStack_38);
  if (-1 < sVar1) {
    *(ulong *)((long)puVar2 + 0xc) =
         CONCAT44(addr.sin6_addr.__in6_u.__u6_addr32[0],addr.sin6_flowinfo);
    *(undefined8 *)((long)puVar2 + 0x14) = addr.sin6_addr.__in6_u._4_8_;
    *puVar2 = auStack_38;
    puVar2[1] = CONCAT44(addr.sin6_flowinfo,addr._0_4_);
  }
  return sVar1;
}

Assistant:

sockets::sz_sock Socket::accept(InetAddress* peeraddr)
{
	struct sockaddr_in6 addr;
	memset(&addr, 0, sizeof(addr));
	sockets::sz_sock connfd = sockets::sz_accept(m_sockfd, &addr);
	if (connfd >= 0)
	{
		peeraddr->setSockAddrInet6(addr);
	}
	return connfd;
}